

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

int SSE8x8_SSE2(uint8_t *a,uint8_t *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  unkuint9 Var33;
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [11];
  undefined1 auVar38 [15];
  unkuint9 Var39;
  undefined1 auVar40 [11];
  undefined1 auVar41 [15];
  undefined1 auVar42 [11];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  long lVar51;
  int iVar52;
  int iVar54;
  int iVar55;
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar57 [16];
  
  iVar52 = 0;
  iVar54 = 0;
  iVar55 = 0;
  iVar56 = 0;
  for (lVar51 = 0; (int)lVar51 != 0x100; lVar51 = lVar51 + 0x40) {
    uVar1 = *(ulong *)(a + lVar51);
    auVar4._8_6_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4[0xe] = (char)(uVar1 >> 0x38);
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar1;
    auVar8[0xc] = (char)(uVar1 >> 0x30);
    auVar8._13_2_ = auVar4._13_2_;
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12._12_3_ = auVar8._12_3_;
    auVar16._8_2_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16[10] = (char)(uVar1 >> 0x28);
    auVar16._11_4_ = auVar12._11_4_;
    auVar20._8_2_ = 0;
    auVar20._0_8_ = uVar1;
    auVar20._10_5_ = auVar16._10_5_;
    auVar24[8] = (char)(uVar1 >> 0x20);
    auVar24._0_8_ = uVar1;
    auVar24._9_6_ = auVar20._9_6_;
    auVar32._7_8_ = 0;
    auVar32._0_7_ = auVar24._8_7_;
    Var33 = CONCAT81(SUB158(auVar32 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar43._9_6_ = 0;
    auVar43._0_9_ = Var33;
    auVar34._1_10_ = SUB1510(auVar43 << 0x30,5);
    auVar34[0] = (char)(uVar1 >> 0x10);
    auVar44._11_4_ = 0;
    auVar44._0_11_ = auVar34;
    auVar28[2] = (char)(uVar1 >> 8);
    auVar28._0_2_ = (ushort)uVar1;
    auVar28._3_12_ = SUB1512(auVar44 << 0x20,3);
    uVar2 = *(ulong *)(a + lVar51 + 0x20);
    auVar5._8_6_ = 0;
    auVar5._0_8_ = uVar2;
    auVar5[0xe] = (char)(uVar2 >> 0x38);
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar2;
    auVar9[0xc] = (char)(uVar2 >> 0x30);
    auVar9._13_2_ = auVar5._13_2_;
    auVar13._8_4_ = 0;
    auVar13._0_8_ = uVar2;
    auVar13._12_3_ = auVar9._12_3_;
    auVar17._8_2_ = 0;
    auVar17._0_8_ = uVar2;
    auVar17[10] = (char)(uVar2 >> 0x28);
    auVar17._11_4_ = auVar13._11_4_;
    auVar21._8_2_ = 0;
    auVar21._0_8_ = uVar2;
    auVar21._10_5_ = auVar17._10_5_;
    auVar25[8] = (char)(uVar2 >> 0x20);
    auVar25._0_8_ = uVar2;
    auVar25._9_6_ = auVar21._9_6_;
    auVar35._7_8_ = 0;
    auVar35._0_7_ = auVar25._8_7_;
    Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),(char)(uVar2 >> 0x18));
    auVar45._9_6_ = 0;
    auVar45._0_9_ = Var36;
    auVar37._1_10_ = SUB1510(auVar45 << 0x30,5);
    auVar37[0] = (char)(uVar2 >> 0x10);
    auVar46._11_4_ = 0;
    auVar46._0_11_ = auVar37;
    auVar29[2] = (char)(uVar2 >> 8);
    auVar29._0_2_ = (ushort)uVar2;
    auVar29._3_12_ = SUB1512(auVar46 << 0x20,3);
    uVar3 = *(ulong *)(b + lVar51);
    auVar6._8_6_ = 0;
    auVar6._0_8_ = uVar3;
    auVar6[0xe] = (char)(uVar3 >> 0x38);
    auVar10._8_4_ = 0;
    auVar10._0_8_ = uVar3;
    auVar10[0xc] = (char)(uVar3 >> 0x30);
    auVar10._13_2_ = auVar6._13_2_;
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar3;
    auVar14._12_3_ = auVar10._12_3_;
    auVar18._8_2_ = 0;
    auVar18._0_8_ = uVar3;
    auVar18[10] = (char)(uVar3 >> 0x28);
    auVar18._11_4_ = auVar14._11_4_;
    auVar22._8_2_ = 0;
    auVar22._0_8_ = uVar3;
    auVar22._10_5_ = auVar18._10_5_;
    auVar26[8] = (char)(uVar3 >> 0x20);
    auVar26._0_8_ = uVar3;
    auVar26._9_6_ = auVar22._9_6_;
    auVar38._7_8_ = 0;
    auVar38._0_7_ = auVar26._8_7_;
    Var39 = CONCAT81(SUB158(auVar38 << 0x40,7),(char)(uVar3 >> 0x18));
    auVar47._9_6_ = 0;
    auVar47._0_9_ = Var39;
    auVar40._1_10_ = SUB1510(auVar47 << 0x30,5);
    auVar40[0] = (char)(uVar3 >> 0x10);
    auVar48._11_4_ = 0;
    auVar48._0_11_ = auVar40;
    auVar30[2] = (char)(uVar3 >> 8);
    auVar30._0_2_ = (ushort)uVar3;
    auVar30._3_12_ = SUB1512(auVar48 << 0x20,3);
    auVar53._0_2_ = ((ushort)uVar1 & 0xff) - ((ushort)uVar3 & 0xff);
    auVar53._2_2_ = auVar28._2_2_ - auVar30._2_2_;
    auVar53._4_2_ = auVar34._0_2_ - auVar40._0_2_;
    auVar53._6_2_ = (short)Var33 - (short)Var39;
    auVar53._8_2_ = auVar24._8_2_ - auVar26._8_2_;
    auVar53._10_2_ = auVar16._10_2_ - auVar18._10_2_;
    auVar53._12_2_ = auVar8._12_2_ - auVar10._12_2_;
    auVar53._14_2_ = (auVar4._13_2_ >> 8) - (auVar6._13_2_ >> 8);
    uVar1 = *(ulong *)(b + lVar51 + 0x20);
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7[0xe] = (char)(uVar1 >> 0x38);
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[0xc] = (char)(uVar1 >> 0x30);
    auVar11._13_2_ = auVar7._13_2_;
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15._12_3_ = auVar11._12_3_;
    auVar19._8_2_ = 0;
    auVar19._0_8_ = uVar1;
    auVar19[10] = (char)(uVar1 >> 0x28);
    auVar19._11_4_ = auVar15._11_4_;
    auVar23._8_2_ = 0;
    auVar23._0_8_ = uVar1;
    auVar23._10_5_ = auVar19._10_5_;
    auVar27[8] = (char)(uVar1 >> 0x20);
    auVar27._0_8_ = uVar1;
    auVar27._9_6_ = auVar23._9_6_;
    auVar41._7_8_ = 0;
    auVar41._0_7_ = auVar27._8_7_;
    Var33 = CONCAT81(SUB158(auVar41 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar49._9_6_ = 0;
    auVar49._0_9_ = Var33;
    auVar42._1_10_ = SUB1510(auVar49 << 0x30,5);
    auVar42[0] = (char)(uVar1 >> 0x10);
    auVar50._11_4_ = 0;
    auVar50._0_11_ = auVar42;
    auVar31[2] = (char)(uVar1 >> 8);
    auVar31._0_2_ = (ushort)uVar1;
    auVar31._3_12_ = SUB1512(auVar50 << 0x20,3);
    auVar57._0_2_ = ((ushort)uVar2 & 0xff) - ((ushort)uVar1 & 0xff);
    auVar57._2_2_ = auVar29._2_2_ - auVar31._2_2_;
    auVar57._4_2_ = auVar37._0_2_ - auVar42._0_2_;
    auVar57._6_2_ = (short)Var36 - (short)Var33;
    auVar57._8_2_ = auVar25._8_2_ - auVar27._8_2_;
    auVar57._10_2_ = auVar17._10_2_ - auVar19._10_2_;
    auVar57._12_2_ = auVar9._12_2_ - auVar11._12_2_;
    auVar57._14_2_ = (auVar5._13_2_ >> 8) - (auVar7._13_2_ >> 8);
    auVar53 = pmaddwd(auVar53,auVar53);
    auVar57 = pmaddwd(auVar57,auVar57);
    iVar52 = auVar53._0_4_ + iVar52 + auVar57._0_4_;
    iVar54 = auVar53._4_4_ + iVar54 + auVar57._4_4_;
    iVar55 = auVar53._8_4_ + iVar55 + auVar57._8_4_;
    iVar56 = auVar53._12_4_ + iVar56 + auVar57._12_4_;
  }
  return iVar56 + iVar54 + iVar55 + iVar52;
}

Assistant:

static int SSE8x8_SSE2(const uint8_t* WEBP_RESTRICT a,
                       const uint8_t* WEBP_RESTRICT b) {
  const __m128i zero = _mm_setzero_si128();
  int num_pairs = 4;
  __m128i sum = zero;
  int32_t tmp[4];
  while (num_pairs-- > 0) {
    const __m128i a0 = LOAD_8x16b(&a[BPS * 0]);
    const __m128i a1 = LOAD_8x16b(&a[BPS * 1]);
    const __m128i b0 = LOAD_8x16b(&b[BPS * 0]);
    const __m128i b1 = LOAD_8x16b(&b[BPS * 1]);
    // subtract
    const __m128i c0 = _mm_subs_epi16(a0, b0);
    const __m128i c1 = _mm_subs_epi16(a1, b1);
    // multiply/accumulate with self
    const __m128i d0 = _mm_madd_epi16(c0, c0);
    const __m128i d1 = _mm_madd_epi16(c1, c1);
    // collect
    const __m128i sum01 = _mm_add_epi32(d0, d1);
    sum = _mm_add_epi32(sum, sum01);
    a += 2 * BPS;
    b += 2 * BPS;
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  return (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
}